

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

void __thiscall
dgMeshEffect::GetMaterialGetIndexStream
          (dgMeshEffect *this,dgIndexArray *handle,HaI32 materialHandle,HaI32 *indexArray)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = handle->m_indexCount;
  if (0 < iVar4) {
    lVar3 = 0;
    iVar5 = 0;
    iVar1 = handle->m_materials[materialHandle];
    piVar2 = handle->m_indexList + 3;
    do {
      if (*piVar2 == iVar1) {
        indexArray[iVar5] = piVar2[-3];
        indexArray[(long)iVar5 + 1] = piVar2[-2];
        indexArray[(long)iVar5 + 2] = piVar2[-1];
        iVar5 = iVar5 + 3;
        iVar4 = handle->m_indexCount;
      }
      lVar3 = lVar3 + 1;
      piVar2 = piVar2 + 4;
    } while (lVar3 < iVar4);
  }
  return;
}

Assistant:

void dgMeshEffect::GetMaterialGetIndexStream (dgIndexArray* const handle, hacd::HaI32 materialHandle, hacd::HaI32* const indexArray)
{
	hacd::HaI32 index;
	hacd::HaI32 textureID;

	index = 0;
	textureID = handle->m_materials[materialHandle];
	for (hacd::HaI32 j = 0; j < handle->m_indexCount; j ++) {
		if (handle->m_indexList[j * 4 + 3] == textureID) {
			indexArray[index + 0] = handle->m_indexList[j * 4 + 0];
			indexArray[index + 1] = handle->m_indexList[j * 4 + 1];
			indexArray[index + 2] = handle->m_indexList[j * 4 + 2];

			index += 3;
		}
	}
}